

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O2

void Js::CompoundString::UnpackSubstringInfo
               (void *pointer,void *pointer2,CharCount *startIndexRef,CharCount *lengthRef)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (pointer == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x2fd,"(pointer)","pointer");
    if (!bVar2) goto LAB_00a0a088;
    *puVar3 = 0;
  }
  if (startIndexRef == (CharCount *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x2fe,"(startIndexRef)","startIndexRef");
    if (!bVar2) goto LAB_00a0a088;
    *puVar3 = 0;
  }
  if (lengthRef == (CharCount *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x2ff,"(lengthRef)","lengthRef");
    if (!bVar2) goto LAB_00a0a088;
    *puVar3 = 0;
  }
  if (((ulong)pointer & 1) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x302,"(packedSubstringInfo & 1)","packedSubstringInfo & 1");
    if (!bVar2) goto LAB_00a0a088;
    *puVar3 = 0;
  }
  if (pointer2 != (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x306,"(!pointer2)","!pointer2");
    if (!bVar2) {
LAB_00a0a088:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  *startIndexRef = (CharCount)((ulong)pointer >> 0x20);
  *lengthRef = (uint)((ulong)pointer >> 1) & 0x7fffffff;
  return;
}

Assistant:

inline void CompoundString::UnpackSubstringInfo(
        void *const pointer,
        void *const pointer2,
        CharCount *const startIndexRef,
        CharCount *const lengthRef)
    {
        Assert(pointer);
        Assert(startIndexRef);
        Assert(lengthRef);

        const uintptr_t packedSubstringInfo = reinterpret_cast<uintptr_t>(pointer);
        Assert(packedSubstringInfo & 1);

    #if defined(TARGET_64)
        // On 64-bit architectures, two nonnegative 32-bit ints fit completely in a tagged pointer
        Assert(!pointer2);
        *startIndexRef = static_cast<CharCount>(packedSubstringInfo >> 32);
        *lengthRef = static_cast<CharCount>(static_cast<uint32>(packedSubstringInfo) >> 1);
    #else
        CompileAssert(sizeof(void *) == sizeof(int32));

        // On 32-bit architectures, it will be attempted to fit both pieces of into one pointer by using 16 bits for the
        // start index, 15 for the length, and 1 for the tag. If it does not fit, an additional pointer will be used.
        if(!pointer2)
        {
            *startIndexRef = static_cast<CharCount>(packedSubstringInfo >> 16);
            *lengthRef = static_cast<CharCount>(static_cast<uint16>(packedSubstringInfo) >> 1);
        }
        else
        {
            *startIndexRef = static_cast<CharCount>(packedSubstringInfo >> 1);
            const uintptr_t packedSubstringInfo2 = reinterpret_cast<uintptr_t>(pointer2);
            Assert(packedSubstringInfo2 & 1);
            *lengthRef = static_cast<CharCount>(packedSubstringInfo2 >> 1);
        }
    #endif
    }